

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O1

int Smt_PrsBuildConstant(Wlc_Ntk_t *pNtk,char *pStr,int nBits,char *pName)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  Vec_Int_t *vFanins;
  int *piVar6;
  size_t sVar7;
  size_t sVar8;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  ulong uVar9;
  byte *__s;
  long lVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  char *pcVar16;
  uint uVar17;
  byte bVar18;
  byte *pbVar19;
  ulong uVar20;
  int iVar21;
  int fFound;
  int local_34;
  
  sVar7 = (size_t)(uint)nBits;
  vFanins = (Vec_Int_t *)malloc(0x10);
  vFanins->nCap = 0x10;
  vFanins->nSize = 0;
  piVar6 = (int *)malloc(0x40);
  vFanins->pArray = piVar6;
  if (*pStr == '#') {
    if (pStr[1] == 'x') {
      if (nBits == -1) {
        sVar7 = strlen(pStr + 2);
        sVar7 = (size_t)(uint)((int)sVar7 << 2);
      }
      iVar5 = (int)sVar7;
      uVar14 = ((iVar5 >> 5) + 1) - (uint)((sVar7 & 0x1f) == 0);
      if (0x10 < (int)uVar14) {
        sVar7 = (ulong)uVar14 * 4;
        if (piVar6 == (int *)0x0) {
          piVar6 = (int *)malloc(sVar7);
        }
        else {
          piVar6 = (int *)realloc(piVar6,sVar7);
        }
        vFanins->pArray = piVar6;
        if (piVar6 == (int *)0x0) {
LAB_0034a922:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        vFanins->nCap = uVar14;
      }
      if (0 < (int)uVar14) {
        memset(vFanins->pArray,0,(ulong)uVar14 << 2);
      }
      vFanins->nSize = uVar14;
      if ((0xf5 < (byte)(pStr[2] - 0x3aU)) || (uVar9 = 0, 0xf9 < (byte)((pStr[2] & 0xdfU) + 0xb9)))
      {
        uVar9 = 0;
        do {
          do {
            lVar10 = uVar9 + 3;
            uVar9 = uVar9 + 1;
          } while (0xf5 < (byte)(pStr[lVar10] - 0x3aU));
        } while (0xf9 < (byte)((pStr[lVar10] & 0xdfU) + 0xb9));
      }
      piVar6 = vFanins->pArray;
      iVar11 = (int)uVar9;
      if (iVar11 != 0) {
        pcVar16 = pStr + (long)iVar11 + 1;
        bVar18 = 0;
        uVar20 = 0;
        do {
          cVar1 = *pcVar16;
          iVar21 = -0x30;
          if (((9 < (byte)(cVar1 - 0x30U)) && (iVar21 = -0x37, 5 < (byte)(cVar1 + 0xbfU))) &&
             (iVar21 = -0x57, 5 < (byte)(cVar1 + 0x9fU))) {
LAB_0034a903:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                          ,0x3c8,"int Abc_TtReadHexDigit(char)");
          }
          *(ulong *)(piVar6 + (uVar20 >> 4 & 0xfffffff) * 2) =
               *(ulong *)(piVar6 + (uVar20 >> 4 & 0xfffffff) * 2) |
               (ulong)(uint)(iVar21 + cVar1) << (bVar18 & 0x3c);
          uVar20 = uVar20 + 1;
          bVar18 = bVar18 + 4;
          pcVar16 = pcVar16 + -1;
        } while ((uVar9 & 0xffffffff) != uVar20);
      }
      iVar21 = iVar5 + 6;
      if (-1 < iVar5 + 3) {
        iVar21 = iVar5 + 3;
      }
      if (iVar11 != iVar21 >> 2) goto joined_r0x0034a362;
    }
    else {
      if (pStr[1] != 'b') {
joined_r0x0034a362:
        if (piVar6 != (int *)0x0) {
          free(piVar6);
          vFanins->pArray = (int *)0x0;
        }
        free(vFanins);
        return 0;
      }
      if (nBits == -1) {
        sVar7 = strlen(pStr + 2);
      }
      iVar5 = (int)sVar7;
      uVar14 = ((iVar5 >> 5) + 1) - (uint)((sVar7 & 0x1f) == 0);
      if (0x10 < (int)uVar14) {
        sVar8 = (ulong)uVar14 * 4;
        if (piVar6 == (int *)0x0) {
          piVar6 = (int *)malloc(sVar8);
        }
        else {
          piVar6 = (int *)realloc(piVar6,sVar8);
        }
        vFanins->pArray = piVar6;
        if (piVar6 == (int *)0x0) goto LAB_0034a922;
        vFanins->nCap = uVar14;
      }
      if (0 < (int)uVar14) {
        memset(vFanins->pArray,0,(ulong)uVar14 << 2);
      }
      vFanins->nSize = uVar14;
      if (0 < iVar5) {
        uVar9 = 0;
        iVar11 = iVar5;
        do {
          iVar11 = iVar11 + -1;
          if (pStr[uVar9 + 2] != '0') {
            if (pStr[uVar9 + 2] != '1') {
              piVar6 = vFanins->pArray;
              goto joined_r0x0034a362;
            }
            vFanins->pArray[iVar11 >> 5] = vFanins->pArray[iVar11 >> 5] | 1 << ((byte)iVar11 & 0x1f)
            ;
          }
          uVar9 = uVar9 + 1;
        } while ((sVar7 & 0xffffffff) != uVar9);
      }
    }
  }
  else {
    if (9 < (byte)(*pStr - 0x30U)) {
      iVar5 = Abc_NamStrFindOrAdd(pNtk->pManName,pStr,&local_34);
      if (local_34 == 0) {
        __assert_fail("fFound",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcReadSmt.c"
                      ,0x272,"int Smt_PrsBuildConstant(Wlc_Ntk_t *, char *, int, char *)");
      }
      goto LAB_0034a894;
    }
    sVar8 = strlen(pStr);
    p = (Vec_Int_t *)malloc(0x10);
    uVar14 = (uint)sVar8;
    uVar4 = 0x10;
    if (0xe < uVar14 - 1) {
      uVar4 = uVar14;
    }
    p->nSize = 0;
    p->nCap = uVar4;
    if (uVar4 == 0) {
      piVar6 = (int *)0x0;
    }
    else {
      piVar6 = (int *)malloc((long)(int)uVar4 << 2);
    }
    p->pArray = piVar6;
    if (0 < (int)uVar14) {
      uVar9 = 0;
      do {
        Vec_IntPush(p,pStr[uVar9] + -0x30);
        uVar9 = uVar9 + 1;
      } while ((uVar14 & 0x7fffffff) != uVar9);
    }
    p_00 = (Vec_Int_t *)malloc(0x10);
    p_00->nCap = 0x10;
    p_00->nSize = 0;
    piVar6 = (int *)malloc(0x40);
    p_00->pArray = piVar6;
    if (0 < (int)uVar14) {
      uVar4 = 0;
      iVar5 = 0;
      bVar3 = false;
      do {
        if (((int)uVar4 < 0) || (p->nSize <= (int)uVar4)) goto LAB_0034a8c5;
        iVar11 = p->pArray[uVar4];
        if (iVar11 == 0 && iVar5 == 0) {
          uVar4 = uVar4 + 1;
          iVar5 = 0;
          if ((int)uVar14 <= (int)uVar4) {
            iVar5 = 0;
            if (bVar3) goto LAB_0034a42b;
            break;
          }
        }
        else {
          iVar11 = iVar11 + iVar5 * 10;
          iVar5 = iVar11 % 2;
          p->pArray[uVar4] = iVar11 / 2;
          uVar4 = uVar4 + 1;
          bVar3 = true;
          if ((int)uVar14 <= (int)uVar4) {
LAB_0034a42b:
            Vec_IntPush(p_00,iVar5);
            bVar3 = false;
            iVar5 = 0;
            uVar4 = 0;
          }
        }
      } while ((int)uVar4 < (int)uVar14);
    }
    if (p->pArray != (int *)0x0) {
      free(p->pArray);
      p->pArray = (int *)0x0;
    }
    free(p);
    if (p_00->nSize != 0) goto LAB_0034a624;
    do {
      Vec_IntPush(p_00,0);
LAB_0034a624:
      uVar14 = p_00->nSize;
    } while ((uVar14 & 3) != 0);
    uVar4 = (int)uVar14 >> 2;
    __s = (byte *)malloc((long)(int)(uVar4 + 1));
    if (0 < (int)uVar4) {
      lVar10 = 0;
      uVar12 = 0;
      if (0 < (int)uVar14) {
        uVar12 = uVar14;
      }
      uVar13 = 1;
      if (1 < (int)uVar14) {
        uVar13 = uVar14;
      }
      uVar15 = 2;
      if (2 < (int)uVar14) {
        uVar15 = uVar14;
      }
      uVar17 = 0;
      if (3 < (int)uVar14) {
        uVar17 = uVar14;
      }
      pbVar19 = __s + uVar4;
      do {
        pbVar19 = pbVar19 + -1;
        if (((((ulong)(uVar12 + 3 & 0xfffffffc) << 2 == lVar10) ||
             ((ulong)(uVar13 + 2 & 0xfffffffc) << 2 == lVar10)) ||
            ((ulong)(uVar15 + 1 & 0xfffffffc) << 2 == lVar10)) ||
           ((ulong)(uVar17 & 0x7ffffffc) << 2 == lVar10)) {
LAB_0034a8c5:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar6 = p_00->pArray;
        uVar14 = *(int *)((long)piVar6 + lVar10 + 4) * 2 + *(int *)((long)piVar6 + lVar10) +
                 *(int *)((long)piVar6 + lVar10 + 8) * 4 + *(int *)((long)piVar6 + lVar10 + 0xc) * 8
        ;
        if (0xf < uVar14) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcReadSmt.c"
                        ,0x23a,"char *Smt_GetHexFromDecimalString(char *)");
        }
        *pbVar19 = "0123456789abcdef"[uVar14];
        lVar10 = lVar10 + 0x10;
      } while ((ulong)uVar4 << 4 != lVar10);
    }
    __s[(int)uVar4] = 0;
    if (p_00->pArray != (int *)0x0) {
      free(p_00->pArray);
      p_00->pArray = (int *)0x0;
    }
    free(p_00);
    if (nBits == -1) {
      sVar7 = strlen((char *)__s);
      sVar7 = (size_t)(uint)((int)sVar7 << 2);
    }
    iVar5 = (int)sVar7;
    uVar14 = ((iVar5 >> 5) + 1) - (uint)((sVar7 & 0x1f) == 0);
    if (vFanins->nCap < (int)uVar14) {
      if (vFanins->pArray == (int *)0x0) {
        piVar6 = (int *)malloc((long)(int)uVar14 << 2);
      }
      else {
        piVar6 = (int *)realloc(vFanins->pArray,(long)(int)uVar14 << 2);
      }
      vFanins->pArray = piVar6;
      if (piVar6 == (int *)0x0) goto LAB_0034a922;
      vFanins->nCap = uVar14;
    }
    if (0 < (int)uVar14) {
      memset(vFanins->pArray,0,(ulong)uVar14 << 2);
    }
    vFanins->nSize = uVar14;
    if ((0xf5 < (byte)(*__s - 0x3a)) || (uVar9 = 0, 0xf9 < (byte)((*__s & 0xdf) + 0xb9))) {
      uVar9 = 0;
      do {
        do {
          lVar10 = uVar9 + 1;
          uVar9 = uVar9 + 1;
        } while (0xf5 < (byte)(__s[lVar10] - 0x3a));
      } while (0xf9 < (byte)((__s[lVar10] & 0xdf) + 0xb9));
    }
    if ((int)uVar9 != 0) {
      piVar6 = vFanins->pArray;
      pbVar19 = __s + (int)uVar9;
      bVar18 = 0;
      uVar20 = 0;
      do {
        pbVar19 = pbVar19 + -1;
        bVar2 = *pbVar19;
        iVar11 = -0x30;
        if (((9 < (byte)(bVar2 - 0x30)) && (iVar11 = -0x37, 5 < (byte)(bVar2 + 0xbf))) &&
           (iVar11 = -0x57, 5 < (byte)(bVar2 + 0x9f))) goto LAB_0034a903;
        *(ulong *)(piVar6 + (uVar20 >> 4 & 0xfffffff) * 2) =
             *(ulong *)(piVar6 + (uVar20 >> 4 & 0xfffffff) * 2) |
             (ulong)(uint)(iVar11 + (char)bVar2) << (bVar18 & 0x3c);
        uVar20 = uVar20 + 1;
        bVar18 = bVar18 + 4;
      } while ((uVar9 & 0xffffffff) != uVar20);
    }
    free(__s);
  }
  iVar5 = Smt_PrsCreateNode(pNtk,6,0,iVar5,vFanins,pName);
LAB_0034a894:
  if (vFanins->pArray != (int *)0x0) {
    free(vFanins->pArray);
    vFanins->pArray = (int *)0x0;
  }
  free(vFanins);
  return iVar5;
}

Assistant:

static inline int Smt_PrsBuildConstant( Wlc_Ntk_t * pNtk, char * pStr, int nBits, char * pName )
{
    int i, nDigits, iObj;
    Vec_Int_t * vFanins = Vec_IntAlloc( 10 );
    if ( pStr[0] != '#' ) // decimal
    {
        if ( pStr[0] >= '0' && pStr[0] <= '9' )
        {
            // added: sanity check for large constants
            /*
            Vec_Int_t * temp = Vec_IntAlloc(10);
            int fullBits = -1;
            Smt_GetBinaryFromDecimalString(pStr,temp,&fullBits);
            Vec_IntFree(temp);
            assert(fullBits < 32);*/

            char * pHex = Smt_GetHexFromDecimalString(pStr);
            
            if ( nBits == -1 )
                nBits = strlen(pHex)*4;
            
            //printf("nbits: %d\n",nBits);
            
            Vec_IntFill( vFanins, Abc_BitWordNum(nBits), 0 );
            nDigits = Abc_TtReadHexNumber( (word *)Vec_IntArray(vFanins), pHex );
            ABC_FREE( pHex );
            
            /*
            int w, nWords, Number = atoi( pStr );
            if ( nBits == -1 )
            {
                nBits = Abc_Base2Log( Number+1 );
                assert( nBits < 32 );
            }
            nWords = Abc_BitWordNum( nBits );
            for ( w = 0; w < nWords; w++ )
                Vec_IntPush( vFanins, w ? 0 : Number );
            */
        }
        else
        {
            int fFound, iObj = Abc_NamStrFindOrAdd( pNtk->pManName, pStr, &fFound );
            assert( fFound );
            Vec_IntFree( vFanins );
            return iObj;
        }
    }
    else if ( pStr[1] == 'b' ) // binary
    {
        if ( nBits == -1 )
            nBits = strlen(pStr+2);
        Vec_IntFill( vFanins, Abc_BitWordNum(nBits), 0 );
        for ( i = 0; i < nBits; i++ )
            if ( pStr[2+i] == '1' )
                Abc_InfoSetBit( (unsigned *)Vec_IntArray(vFanins), nBits-1-i );
            else if ( pStr[2+i] != '0' )
            {
                Vec_IntFree( vFanins );
                return 0;
            }
    }
    else if ( pStr[1] == 'x' ) // hexadecimal
    {
        if ( nBits == -1 )
            nBits = strlen(pStr+2)*4;
        Vec_IntFill( vFanins, Abc_BitWordNum(nBits), 0 );
        nDigits = Abc_TtReadHexNumber( (word *)Vec_IntArray(vFanins), pStr+2 );
        if ( nDigits != (nBits + 3)/4 )
        {
            Vec_IntFree( vFanins );
            return 0;
        }
    }
    else 
    {
        Vec_IntFree( vFanins );
        return 0;
    }
    // create constant node
    iObj = Smt_PrsCreateNode( pNtk, WLC_OBJ_CONST, 0, nBits, vFanins, pName );
    Vec_IntFree( vFanins );
    return iObj;
}